

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ShowDebugLogFlag(char *name,ImGuiDebugLogFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  ImVec2 IVar8;
  ImRect local_30;
  
  pIVar6 = GImGui;
  fVar1 = (GImGui->Style).FramePadding.y;
  fVar2 = GImGui->FontSize;
  fVar3 = (GImGui->Style).ItemInnerSpacing.x;
  IVar8 = ImGui::CalcTextSize(name,(char *)0x0,false,-1.0);
  fVar4 = (GImGui->Style).FramePadding.y;
  pIVar5 = GImGui->CurrentWindow;
  local_30.Min.y = (pIVar5->DC).CursorPosPrevLine.y;
  local_30.Min.x = (pIVar5->DC).CursorPosPrevLine.x + (GImGui->Style).ItemSpacing.x;
  local_30.Max.y = local_30.Min.y + fVar4 + fVar4 + GImGui->FontSize;
  local_30.Max.x = local_30.Min.x + IVar8.x + fVar1 + fVar1 + fVar2 + fVar3;
  bVar7 = ImRect::Contains(&pIVar5->WorkRect,&local_30);
  if (bVar7) {
    ImGui::SameLine(0.0,-1.0);
  }
  bVar7 = ImGui::CheckboxFlags(name,&pIVar6->DebugLogFlags,flags);
  if (((bVar7) && ((pIVar6->IO).KeyShift == true)) && ((pIVar6->DebugLogFlags & flags) != 0)) {
    pIVar6->DebugLogAutoDisableFrames = '\x02';
    pIVar6->DebugLogAutoDisableFlags = pIVar6->DebugLogAutoDisableFlags | flags;
  }
  ImGui::SetItemTooltip
            ("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)")
  ;
  return;
}

Assistant:

static void ShowDebugLogFlag(const char* name, ImGuiDebugLogFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size(ImGui::GetFrameHeight() + g.Style.ItemInnerSpacing.x + ImGui::CalcTextSize(name).x, ImGui::GetFrameHeight());
    SameLineOrWrap(size); // FIXME-LAYOUT: To be done automatically once we rework ItemSize/ItemAdd into ItemLayout.
    if (ImGui::CheckboxFlags(name, &g.DebugLogFlags, flags) && g.IO.KeyShift && (g.DebugLogFlags & flags) != 0)
    {
        g.DebugLogAutoDisableFrames = 2;
        g.DebugLogAutoDisableFlags |= flags;
    }
    ImGui::SetItemTooltip("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)");
}